

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O2

bool DiffTest<Blob<128>,unsigned_long>(pfHash hash,int diffbits,int reps,bool dumpCollisions)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> diffs;
  Blob<128> k2;
  unsigned_long h2;
  unsigned_long h1;
  Rand r;
  Blob<128> k1;
  
  dVar3 = chooseUpToK(0x80,diffbits);
  Rand::reseed(&r,100);
  diffs.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diffs.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  diffs.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  Blob<128>::Blob(&k1);
  Blob<128>::Blob(&k2);
  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",dVar3,
         (ulong)(uint)diffbits,0x80,0x40);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",dVar3 * (double)reps,
         dVar3 * (double)reps * 5.421010862427522e-20,(ulong)(uint)reps);
  for (uVar2 = 0; (~(reps >> 0x1f) & reps) != uVar2; uVar2 = uVar2 + 1) {
    if ((int)uVar2 % (reps / 10) == 0) {
      putchar(0x2e);
    }
    Rand::rand_p(&r,&k1,0x10);
    Blob<128>::operator=(&k2,&k1);
    (*hash)(&k1,0x10,0,&h1);
    DiffTestRecurse<Blob<128>,unsigned_long>(hash,&k1,&k2,&h1,&h2,0,diffbits,&diffs);
  }
  putchar(10);
  bVar1 = ProcessDifferentials<Blob<128>>(&diffs,reps,dumpCollisions);
  std::_Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>::~_Vector_base
            (&diffs.super__Vector_base<Blob<128>,_std::allocator<Blob<128>_>_>);
  return bVar1;
}

Assistant:

bool DiffTest ( pfHash hash, int diffbits, int reps, bool dumpCollisions )
{
  const int keybits = sizeof(keytype) * 8;
  const int hashbits = sizeof(hashtype) * 8;

  double diffcount = chooseUpToK(keybits,diffbits);
  double testcount = (diffcount * double(reps));
  double expected  = testcount / pow(2.0,double(hashbits));

  Rand r(100);

  std::vector<keytype> diffs;

  keytype k1,k2;
  hashtype h1,h2;

  printf("Testing %0.f up-to-%d-bit differentials in %d-bit keys -> %d bit hashes.\n",
         diffcount,diffbits,keybits,hashbits);
  printf("%d reps, %0.f total tests, expecting %2.2f random collisions",
         reps,testcount,expected);

  for(int i = 0; i < reps; i++)
  {
    if(i % (reps/10) == 0) printf(".");

    r.rand_p(&k1,sizeof(keytype));
    k2 = k1;

    hash(&k1,sizeof(k1),0,(uint32_t*)&h1);

    DiffTestRecurse<keytype,hashtype>(hash,k1,k2,h1,h2,0,diffbits,diffs);
  }
  printf("\n");

  bool result = true;

  result &= ProcessDifferentials(diffs,reps,dumpCollisions);

  return result;
}